

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_array.cpp
# Opt level: O3

void __thiscall JsonArray_Empty_Test::TestBody(JsonArray_Empty_Test *this)

{
  StrictMock<mock_json_callbacks> *mock_obj;
  FunctionMocker<std::error_code_()> *pFVar1;
  TypedExpectation<std::error_code_()> *pTVar2;
  pointer *__ptr;
  char *message;
  char *in_R9;
  pointer *__ptr_2;
  InSequence _;
  coord local_f8;
  undefined1 local_f0 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e8;
  undefined1 local_e0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  AssertHelper local_c0;
  parser<callbacks_proxy<mock_json_callbacks>_> local_b8;
  
  testing::InSequence::InSequence((InSequence *)local_e0);
  mock_obj = &(this->super_JsonArray).callbacks_;
  pFVar1 = &(this->super_JsonArray).callbacks_.super_mock_json_callbacks.gmock00_begin_array_50;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            (&pFVar1->super_UntypedFunctionMockerBase,mock_obj);
  local_b8.singletons_._M_t.
  super___uniq_ptr_impl<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>,_std::default_delete<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_*,_std::default_delete<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_>_>
  .
  super__Head_base<0UL,_pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>,_std::default_delete<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_>,_true,_true>
        )(__uniq_ptr_data<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>,_std::default_delete<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_>,_true,_true>
          )pFVar1;
  testing::internal::GetWithoutMatchers();
  pTVar2 = testing::internal::MockSpec<std::error_code_()>::InternalExpectedAt
                     ((MockSpec<std::error_code_()> *)&local_b8,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_array.cpp"
                      ,0x2a,"callbacks_","begin_array ()");
  testing::internal::TypedExpectation<std::error_code_()>::Times(pTVar2,1);
  pFVar1 = &(this->super_JsonArray).callbacks_.super_mock_json_callbacks.gmock00_end_array_51;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            (&pFVar1->super_UntypedFunctionMockerBase,mock_obj);
  local_b8.singletons_._M_t.
  super___uniq_ptr_impl<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>,_std::default_delete<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_*,_std::default_delete<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_>_>
  .
  super__Head_base<0UL,_pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>,_std::default_delete<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_>,_true,_true>
        )(__uniq_ptr_data<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>,_std::default_delete<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_>,_true,_true>
          )pFVar1;
  testing::internal::GetWithoutMatchers();
  pTVar2 = testing::internal::MockSpec<std::error_code_()>::InternalExpectedAt
                     ((MockSpec<std::error_code_()> *)&local_b8,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_array.cpp"
                      ,0x2b,"callbacks_","end_array ()");
  testing::internal::TypedExpectation<std::error_code_()>::Times(pTVar2,1);
  testing::InSequence::~InSequence((InSequence *)local_e0);
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::parser
            (&local_b8,(this->super_JsonArray).proxy_.original_,none);
  local_d0._M_allocated_capacity._0_4_ = 0xa5d0a5b;
  local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000004;
  local_d0._M_allocated_capacity._4_4_ = local_d0._M_allocated_capacity._4_4_ & 0xffffff00;
  local_e0 = (undefined1  [8])&local_d0;
  pstore::gsl::details::extent_type<-1L>::extent_type((extent_type<_1L> *)local_f0,4);
  local_e8 = &local_d0;
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>>::
  input<pstore::gsl::span<char_const,_1l>>
            ((parser<callbacks_proxy<mock_json_callbacks>> *)&local_b8,
             (span<const_char,__1L> *)local_f0);
  if (local_e0 != (undefined1  [8])&local_d0) {
    operator_delete((void *)local_e0,
                    CONCAT44(local_d0._M_allocated_capacity._4_4_,
                             local_d0._M_allocated_capacity._0_4_) + 1);
  }
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::eof(&local_b8);
  local_f0[0] = local_b8.error_._M_value == 0;
  local_e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
  if (local_b8.error_._M_value != 0) {
    testing::Message::Message((Message *)&local_f8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_f8 + 0x10),"Expected the parse to succeed",0x1d);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_e0,(internal *)local_f0,(AssertionResult *)"p.last_error ()","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_array.cpp"
               ,0x30,(char *)local_e0);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if (local_e0 != (undefined1  [8])&local_d0) {
      operator_delete((void *)local_e0,
                      CONCAT44(local_d0._M_allocated_capacity._4_4_,
                               local_d0._M_allocated_capacity._0_4_) + 1);
    }
    if (local_f8 != (coord)0x0) {
      (**(code **)(*(long *)local_f8 + 8))();
    }
    if (local_e8 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8);
    }
  }
  local_f0._0_4_ = local_b8.coordinate_.column;
  local_f0._4_4_ = local_b8.coordinate_.row;
  local_f8.column = 1;
  local_f8.row = 3;
  testing::internal::CmpHelperEQ<pstore::json::coord,pstore::json::coord>
            ((internal *)local_e0,"p.coordinate ()","(json::coord{1U, 3U})",(coord *)local_f0,
             &local_f8);
  if (local_e0[0] == false) {
    testing::Message::Message((Message *)local_f0);
    if (local_d8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_d8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_array.cpp"
               ,0x31,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f8,(Message *)local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f8);
    if ((coord)local_f0 != (coord)0x0) {
      (**(code **)(*(long *)local_f0 + 8))();
    }
  }
  if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d8,local_d8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.string_._M_dataplus._M_p != &local_b8.string_.field_2) {
    operator_delete(local_b8.string_._M_dataplus._M_p,
                    local_b8.string_.field_2._M_allocated_capacity + 1);
  }
  std::
  deque<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>_>_>
  ::~deque(&local_b8.stack_.c);
  if (local_b8.singletons_._M_t.
      super___uniq_ptr_impl<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>,_std::default_delete<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_*,_std::default_delete<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_>_>
      .
      super__Head_base<0UL,_pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_impl<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>,_std::default_delete<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_>_>
       )0x0) {
    operator_delete((void *)local_b8.singletons_._M_t.
                            super___uniq_ptr_impl<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>,_std::default_delete<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_*,_std::default_delete<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_>_>
                            .
                            super__Head_base<0UL,_pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_*,_false>
                            ._M_head_impl,0x68);
  }
  return;
}

Assistant:

TEST_F (JsonArray, Empty) {
    {
        ::testing::InSequence _;
        EXPECT_CALL (callbacks_, begin_array ()).Times (1);
        EXPECT_CALL (callbacks_, end_array ()).Times (1);
    }
    auto p = json::make_parser (proxy_);
    p.input ("[\n]\n"s);
    p.eof ();
    EXPECT_FALSE (p.last_error ()) << "Expected the parse to succeed";
    EXPECT_EQ (p.coordinate (), (json::coord{1U, 3U}));
}